

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_mktime(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int local_44;
  int iVal_1;
  time_t t;
  tm *pTm;
  jx9_int64 iVal;
  char *zFunction;
  jx9_value **apArg_local;
  jx9_context *pjStack_10;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pTm = (tm *)0x0;
  zFunction = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_10 = pCtx;
  iVal = (jx9_int64)jx9_function_name(pCtx);
  time((time_t *)&stack0xffffffffffffffc0);
  if (*(char *)iVal == 'g') {
    t = (time_t)gmtime((time_t *)&stack0xffffffffffffffc0);
  }
  else {
    t = (time_t)localtime((time_t *)&stack0xffffffffffffffc0);
  }
  if (0 < apArg_local._4_4_) {
    iVar1 = jx9_value_to_int(*(jx9_value **)zFunction);
    *(int *)(t + 8) = iVar1;
    if (1 < apArg_local._4_4_) {
      iVar1 = jx9_value_to_int(*(jx9_value **)(zFunction + 8));
      *(int *)(t + 4) = iVar1;
      if (2 < apArg_local._4_4_) {
        iVar1 = jx9_value_to_int(*(jx9_value **)(zFunction + 0x10));
        *(int *)t = iVar1;
        if (3 < apArg_local._4_4_) {
          iVar1 = jx9_value_to_int(*(jx9_value **)(zFunction + 0x18));
          *(int *)(t + 0x10) = iVar1 + -1;
          if (4 < apArg_local._4_4_) {
            iVar1 = jx9_value_to_int(*(jx9_value **)(zFunction + 0x20));
            *(int *)(t + 0xc) = iVar1;
            if (5 < apArg_local._4_4_) {
              local_44 = jx9_value_to_int(*(jx9_value **)(zFunction + 0x28));
              if (0x76c < local_44) {
                local_44 = local_44 + -0x76c;
              }
              *(int *)(t + 0x14) = local_44;
              if (6 < apArg_local._4_4_) {
                iVar1 = jx9_value_to_bool(*(jx9_value **)(zFunction + 0x30));
                *(int *)(t + 0x20) = iVar1;
              }
            }
          }
        }
      }
    }
  }
  pTm = (tm *)mktime((tm *)t);
  jx9_result_int64(pjStack_10,(jx9_int64)pTm);
  return 0;
}

Assistant:

static int jx9Builtin_mktime(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFunction;
	jx9_int64 iVal = 0;
	struct tm *pTm;
	time_t t;
	/* Extract function name */
	zFunction = jx9_function_name(pCtx);
	/* Get the current time */
	time(&t);
	if( zFunction[0] == 'g' /* gmmktime */ ){
		pTm = gmtime(&t);
	}else{
		/* localtime */
		pTm = localtime(&t);
	}
	if( nArg > 0 ){
		int iVal;
		/* Hour */
		iVal = jx9_value_to_int(apArg[0]);
		pTm->tm_hour = iVal;
		if( nArg > 1 ){
			/* Minutes */
			iVal = jx9_value_to_int(apArg[1]);
			pTm->tm_min = iVal;
			if( nArg > 2 ){
				/* Seconds */
				iVal = jx9_value_to_int(apArg[2]);
				pTm->tm_sec = iVal;
				if( nArg > 3 ){
					/* Month */
					iVal = jx9_value_to_int(apArg[3]);
					pTm->tm_mon = iVal - 1;
					if( nArg > 4 ){
						/* mday */
						iVal = jx9_value_to_int(apArg[4]);
						pTm->tm_mday = iVal;
						if( nArg > 5 ){
							/* Year */
							iVal = jx9_value_to_int(apArg[5]);
							if( iVal > 1900 ){
								iVal -= 1900;
							}
							pTm->tm_year = iVal;
							if( nArg > 6 ){
								/* is_dst */
								iVal = jx9_value_to_bool(apArg[6]);
								pTm->tm_isdst = iVal;
							}
						}
					}
				}
			}
		}
	}
	/* Make the time */
	iVal = (jx9_int64)mktime(pTm);
	/* Return the timesatmp as a 64bit integer */
	jx9_result_int64(pCtx, iVal);
	return JX9_OK;
}